

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O0

void writeUint64InBigEndian(void *memory,uint64_t value)

{
  uint8_t *p;
  uint64_t value_local;
  void *memory_local;
  
  *(char *)memory = (char)(value >> 0x38);
  *(char *)((long)memory + 1) = (char)(value >> 0x30);
  *(char *)((long)memory + 2) = (char)(value >> 0x28);
  *(char *)((long)memory + 3) = (char)(value >> 0x20);
  *(char *)((long)memory + 4) = (char)(value >> 0x18);
  *(char *)((long)memory + 5) = (char)(value >> 0x10);
  *(char *)((long)memory + 6) = (char)(value >> 8);
  *(char *)((long)memory + 7) = (char)value;
  return;
}

Assistant:

void writeUint64InBigEndian(void* memory, uint64_t value)
{
	uint8_t* p = memory;
	p[0] = (uint8_t)(value >> 56);
	p[1] = (uint8_t)(value >> 48);
	p[2] = (uint8_t)(value >> 40);
	p[3] = (uint8_t)(value >> 32);
	p[4] = (uint8_t)(value >> 24);
	p[5] = (uint8_t)(value >> 16);
	p[6] = (uint8_t)(value >> 8);
	p[7] = (uint8_t)(value);
}